

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

Snapshot * __thiscall cmState::CreateBaseSnapshot(Snapshot *__return_storage_ptr__,cmState *this)

{
  bool bVar1;
  PointerType pSVar2;
  PointerType pBVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  iterator iVar8;
  cmLinkedTree<cmDefinitions> *local_100;
  PositionType local_f8;
  cmLinkedTree<cmDefinitions> *local_f0;
  PositionType local_e8;
  cmLinkedTree<cmDefinitions> *local_d0;
  PositionType local_c8;
  cmLinkedTree<cmState::PolicyStackEntry> *local_c0;
  PositionType local_b8;
  cmLinkedTree<cmState::PolicyStackEntry> *local_b0;
  PositionType local_a8;
  cmLinkedTree<cmState::PolicyStackEntry> *local_a0;
  PositionType local_98;
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_80;
  PositionType local_78;
  cmLinkedTree<cmState::BuildsystemDirectoryStateType> *local_60;
  PositionType local_58;
  cmLinkedTree<cmState::SnapshotDataType> *local_50;
  PositionType local_48;
  cmLinkedTree<cmState::SnapshotDataType> *local_40;
  PositionType local_38;
  undefined1 local_20 [8];
  PositionType pos;
  cmState *this_local;
  
  pos.Position = (PositionType)this;
  iVar4 = cmLinkedTree<cmState::SnapshotDataType>::Root(&this->SnapshotData);
  _local_20 = cmLinkedTree<cmState::SnapshotDataType>::Push(&this->SnapshotData,iVar4);
  iVar4 = cmLinkedTree<cmState::SnapshotDataType>::Root(&this->SnapshotData);
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  local_40 = iVar4.Tree;
  (pSVar2->DirectoryParent).Tree = local_40;
  local_38 = iVar4.Position;
  (pSVar2->DirectoryParent).Position = local_38;
  iVar4 = cmLinkedTree<cmState::SnapshotDataType>::Root(&this->SnapshotData);
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  local_50 = iVar4.Tree;
  (pSVar2->ScopeParent).Tree = local_50;
  local_48 = iVar4.Position;
  (pSVar2->ScopeParent).Position = local_48;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  pSVar2->SnapshotType = BaseType;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  pSVar2->Keep = true;
  iVar5 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Root(&this->BuildsystemDirectory);
  iVar5 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Push
                    (&this->BuildsystemDirectory,iVar5);
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  local_60 = iVar5.Tree;
  (pSVar2->BuildSystemDirectory).Tree = local_60;
  local_58 = iVar5.Position;
  (pSVar2->BuildSystemDirectory).Position = local_58;
  iVar6 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Root(&this->ExecutionListFiles);
  iVar6 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Push(&this->ExecutionListFiles,iVar6);
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  local_80 = iVar6.Tree;
  (pSVar2->ExecutionListFile).Tree = local_80;
  local_78 = iVar6.Position;
  (pSVar2->ExecutionListFile).Position = local_78;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  pSVar2->IncludeDirectoryPosition = 0;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  pSVar2->CompileDefinitionsPosition = 0;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  pSVar2->CompileOptionsPosition = 0;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar2->BuildSystemDirectory);
  (pBVar3->DirectoryEnd).Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_20;
  (pBVar3->DirectoryEnd).Position = (PositionType)pos.Tree;
  iVar7 = cmLinkedTree<cmState::PolicyStackEntry>::Root(&this->PolicyStack);
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  local_a0 = iVar7.Tree;
  (pSVar2->Policies).Tree = local_a0;
  local_98 = iVar7.Position;
  (pSVar2->Policies).Position = local_98;
  iVar7 = cmLinkedTree<cmState::PolicyStackEntry>::Root(&this->PolicyStack);
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  local_b0 = iVar7.Tree;
  (pSVar2->PolicyRoot).Tree = local_b0;
  local_a8 = iVar7.Position;
  (pSVar2->PolicyRoot).Position = local_a8;
  iVar7 = cmLinkedTree<cmState::PolicyStackEntry>::Root(&this->PolicyStack);
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  local_c0 = iVar7.Tree;
  (pSVar2->PolicyScope).Tree = local_c0;
  local_b8 = iVar7.Position;
  (pSVar2->PolicyScope).Position = local_b8;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  bVar1 = cmLinkedTree<cmState::PolicyStackEntry>::iterator::IsValid(&pSVar2->Policies);
  if (!bVar1) {
    __assert_fail("pos->Policies.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                  ,0x346,"cmState::Snapshot cmState::CreateBaseSnapshot()");
  }
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  bVar1 = cmLinkedTree<cmState::PolicyStackEntry>::iterator::IsValid(&pSVar2->PolicyRoot);
  if (!bVar1) {
    __assert_fail("pos->PolicyRoot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                  ,0x347,"cmState::Snapshot cmState::CreateBaseSnapshot()");
  }
  iVar8 = cmLinkedTree<cmDefinitions>::Root(&this->VarTree);
  iVar8 = cmLinkedTree<cmDefinitions>::Push(&this->VarTree,iVar8);
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  local_d0 = iVar8.Tree;
  (pSVar2->Vars).Tree = local_d0;
  local_c8 = iVar8.Position;
  (pSVar2->Vars).Position = local_c8;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  bVar1 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar2->Vars);
  if (!bVar1) {
    __assert_fail("pos->Vars.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                  ,0x349,"cmState::Snapshot cmState::CreateBaseSnapshot()");
  }
  iVar8 = cmLinkedTree<cmDefinitions>::Root(&this->VarTree);
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  local_f0 = iVar8.Tree;
  (pSVar2->Parent).Tree = local_f0;
  local_e8 = iVar8.Position;
  (pSVar2->Parent).Position = local_e8;
  iVar8 = cmLinkedTree<cmDefinitions>::Root(&this->VarTree);
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  local_100 = iVar8.Tree;
  (pSVar2->Root).Tree = local_100;
  local_f8 = iVar8.Position;
  (pSVar2->Root).Position = local_f8;
  Snapshot::Snapshot(__return_storage_ptr__,this,_local_20);
  return __return_storage_ptr__;
}

Assistant:

cmState::Snapshot cmState::CreateBaseSnapshot()
{
  PositionType pos = this->SnapshotData.Push(this->SnapshotData.Root());
  pos->DirectoryParent = this->SnapshotData.Root();
  pos->ScopeParent = this->SnapshotData.Root();
  pos->SnapshotType = BaseType;
  pos->Keep = true;
  pos->BuildSystemDirectory =
      this->BuildsystemDirectory.Push(this->BuildsystemDirectory.Root());
  pos->ExecutionListFile =
      this->ExecutionListFiles.Push(this->ExecutionListFiles.Root());
  pos->IncludeDirectoryPosition = 0;
  pos->CompileDefinitionsPosition = 0;
  pos->CompileOptionsPosition = 0;
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->Policies = this->PolicyStack.Root();
  pos->PolicyRoot = this->PolicyStack.Root();
  pos->PolicyScope = this->PolicyStack.Root();
  assert(pos->Policies.IsValid());
  assert(pos->PolicyRoot.IsValid());
  pos->Vars = this->VarTree.Push(this->VarTree.Root());
  assert(pos->Vars.IsValid());
  pos->Parent = this->VarTree.Root();
  pos->Root = this->VarTree.Root();
  return cmState::Snapshot(this, pos);
}